

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupPermFlop(Gia_Man_t *p,Vec_Int_t *vFfPerm)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint *__ptr;
  ulong uVar7;
  void *__s;
  long lVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  
  uVar15 = vFfPerm->nSize;
  if (uVar15 != p->nRegs) {
    __assert_fail("Vec_IntSize(vFfPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x2e5,"Gia_Man_t *Gia_ManDupPermFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  __ptr[3] = 0;
  if ((ulong)uVar15 != 0) {
    piVar3 = vFfPerm->pArray;
    iVar6 = *piVar3;
    if (1 < (int)uVar15) {
      uVar7 = 1;
      do {
        if (iVar6 <= piVar3[uVar7]) {
          iVar6 = piVar3[uVar7];
        }
        uVar7 = uVar7 + 1;
      } while (uVar15 != uVar7);
    }
    uVar16 = iVar6 + 1;
    if (-1 < iVar6) {
      __s = malloc((ulong)uVar16 << 2);
      *(void **)(__ptr + 2) = __s;
      if (__s == (void *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      *__ptr = uVar16;
      memset(__s,0xff,(ulong)uVar16 << 2);
    }
    __ptr[1] = uVar16;
    if (0 < (int)uVar15) {
      lVar8 = 0;
      do {
        uVar15 = piVar3[lVar8];
        if ((ulong)uVar15 != 0xffffffff) {
          if (((int)uVar15 < 0) || (iVar6 < (int)uVar15)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)(*(long *)(__ptr + 2) + (ulong)uVar15 * 4) = (int)lVar8;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < vFfPerm->nSize);
    }
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pName = pcVar10;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  pVVar13 = p->vCis;
  uVar7 = (ulong)(uint)pVVar13->nSize;
  if (p->nRegs < pVVar13->nSize) {
    lVar8 = 0;
    do {
      if ((int)uVar7 <= lVar8) goto LAB_00671c9e;
      iVar6 = pVVar13->pArray[lVar8];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00671c7f;
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar7 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar7 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar12 = p_00->pObjs;
      if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_00671cbd;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar12) >> 2) * -0x55555555);
      pGVar12 = p_00->pObjs;
      if ((pGVar11 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar11)) goto LAB_00671cbd;
      pGVar5[iVar6].Value = (int)((ulong)((long)pGVar11 - (long)pGVar12) >> 2) * 0x55555556;
      lVar8 = lVar8 + 1;
      pVVar13 = p->vCis;
      uVar7 = (ulong)pVVar13->nSize;
    } while (lVar8 < (long)(uVar7 - (long)p->nRegs));
  }
  uVar7 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar8 = 0;
    do {
      iVar6 = p->vCis->nSize;
      uVar7 = (ulong)(uint)(iVar6 - (int)uVar7) + lVar8;
      iVar14 = (int)uVar7;
      if ((iVar14 < 0) || (iVar6 <= iVar14)) goto LAB_00671c9e;
      iVar6 = p->vCis->pArray[uVar7 & 0xffffffff];
      if ((iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00671c7f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar7 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar7 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) {
LAB_00671cbd:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) goto LAB_00671cbd;
      if ((int)__ptr[1] <= lVar8) goto LAB_00671c9e;
      iVar6 = *(int *)(*(long *)(__ptr + 2) + lVar8 * 4);
      if (p->nRegs <= iVar6) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a8,"Gia_Obj_t *Gia_ManRo(Gia_Man_t *, int)");
      }
      iVar14 = p->vCis->nSize;
      uVar15 = (iVar14 - p->nRegs) + iVar6;
      if (((int)uVar15 < 0) || (iVar14 <= (int)uVar15)) goto LAB_00671c9e;
      iVar6 = p->vCis->pArray[uVar15];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00671c7f;
      p->pObjs[iVar6].Value = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
      lVar8 = lVar8 + 1;
      uVar7 = (ulong)p->nRegs;
    } while (lVar8 < (long)uVar7);
  }
  if (0 < p->nObjs) {
    lVar8 = 8;
    lVar17 = 0;
    do {
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar7 = *(ulong *)((long)pGVar5 + lVar8 + -8);
      if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
        uVar15 = *(uint *)((long)pGVar5 + lVar8 + (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3
                          );
        if (((int)uVar15 < 0) ||
           (uVar16 = *(uint *)((long)pGVar5 +
                              lVar8 + (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar16 < 0)) goto LAB_00671cdc;
        iVar6 = Gia_ManAppendAnd(p_00,uVar15 ^ (uint)(uVar7 >> 0x1d) & 1,
                                 uVar16 ^ (uint)(uVar7 >> 0x3d) & 1);
        *(int *)(&pGVar5->field_0x0 + lVar8) = iVar6;
      }
      lVar17 = lVar17 + 1;
      lVar8 = lVar8 + 0xc;
    } while (lVar17 < p->nObjs);
  }
  pVVar13 = p->vCos;
  uVar7 = (ulong)(uint)pVVar13->nSize;
  if (p->nRegs < pVVar13->nSize) {
    lVar8 = 0;
    do {
      if ((int)uVar7 <= lVar8) goto LAB_00671c9e;
      iVar6 = pVVar13->pArray[lVar8];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00671c7f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = p->pObjs + iVar6;
      if ((int)pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value < 0)
      goto LAB_00671cdc;
      uVar15 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar5 >> 0x1d & 1 ^
                                    pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value
                              );
      pGVar5->Value = uVar15;
      lVar8 = lVar8 + 1;
      pVVar13 = p->vCos;
      uVar7 = (ulong)pVVar13->nSize;
    } while (lVar8 < (long)(uVar7 - (long)p->nRegs));
  }
  uVar7 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar8 = 0;
    do {
      iVar6 = p->vCos->nSize;
      uVar15 = iVar6 - (int)uVar7;
      uVar1 = (ulong)uVar15 + lVar8;
      iVar14 = (int)uVar1;
      if ((iVar14 < 0) || (iVar6 <= iVar14)) {
LAB_00671c9e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = p->vCos->pArray;
      iVar14 = piVar3[uVar1 & 0xffffffff];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) {
LAB_00671c7f:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = p->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      if ((int)__ptr[1] <= lVar8) goto LAB_00671c9e;
      iVar2 = *(int *)(*(long *)(__ptr + 2) + lVar8 * 4);
      if ((int)uVar7 <= iVar2) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a9,"Gia_Obj_t *Gia_ManRi(Gia_Man_t *, int)");
      }
      uVar15 = iVar2 + uVar15;
      if (((int)uVar15 < 0) || (iVar6 <= (int)uVar15)) goto LAB_00671c9e;
      iVar6 = piVar3[uVar15];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00671c7f;
      uVar16 = (uint)*(undefined8 *)(pGVar5 + iVar6);
      uVar15 = (pGVar5 + iVar6)[-(ulong)(uVar16 & 0x1fffffff)].Value;
      if ((int)uVar15 < 0) {
LAB_00671cdc:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      uVar15 = Gia_ManAppendCo(p_00,uVar16 >> 0x1d & 1 ^ uVar15);
      pGVar5[iVar14].Value = uVar15;
      lVar8 = lVar8 + 1;
      uVar7 = (ulong)p->nRegs;
    } while (lVar8 < (long)uVar7);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupPermFlop( Gia_Man_t * p, Vec_Int_t * vFfPerm )
{
    Vec_Int_t * vPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vFfPerm) == Gia_ManRegNum(p) );
    vPermInv = Vec_IntInvert( vFfPerm, -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManRo(p, Vec_IntEntry(vPermInv, i))->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vPermInv, i)) ) );
    Vec_IntFree( vPermInv );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}